

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O1

void __thiscall icu_63::NFRule::~NFRule(NFRule *this)

{
  NFSubstitution *pNVar1;
  
  pNVar1 = this->sub2;
  if (this->sub1 != pNVar1) {
    if (pNVar1 != (NFSubstitution *)0x0) {
      (*(pNVar1->super_UObject)._vptr_UObject[1])();
    }
    this->sub2 = (NFSubstitution *)0x0;
  }
  if (this->sub1 != (NFSubstitution *)0x0) {
    (*(this->sub1->super_UObject)._vptr_UObject[1])();
  }
  this->sub1 = (NFSubstitution *)0x0;
  if (this->rulePatternFormat != (PluralFormat *)0x0) {
    (*(this->rulePatternFormat->super_Format).super_UObject._vptr_UObject[1])();
  }
  this->rulePatternFormat = (PluralFormat *)0x0;
  UnicodeString::~UnicodeString(&this->fRuleText);
  return;
}

Assistant:

NFRule::~NFRule()
{
    if (sub1 != sub2) {
        delete sub2;
        sub2 = NULL;
    }
    delete sub1;
    sub1 = NULL;
    delete rulePatternFormat;
    rulePatternFormat = NULL;
}